

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

int run_test_getaddrinfo_concurrent(void)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *puVar3;
  int *data;
  int r;
  int i;
  
  data._4_4_ = 0;
  while( true ) {
    if (9 < data._4_4_) {
      puVar3 = uv_default_loop();
      uv_run(puVar3,UV_RUN_DEFAULT);
      data._4_4_ = 0;
      while( true ) {
        if (9 < data._4_4_) {
          puVar3 = uv_default_loop();
          close_loop(puVar3);
          puVar3 = uv_default_loop();
          iVar1 = uv_loop_close(puVar3);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
                    ,0xbd,"0 == uv_loop_close(uv_default_loop())");
            abort();
          }
          return 0;
        }
        if (callback_counts[data._4_4_] != 1) break;
        data._4_4_ = data._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
              ,0xba,"callback_counts[i] == 1");
      abort();
    }
    callback_counts[data._4_4_] = 0;
    piVar2 = (int *)malloc(4);
    if (piVar2 == (int *)0x0) break;
    *piVar2 = data._4_4_;
    getaddrinfo_handles[data._4_4_].data = piVar2;
    puVar3 = uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar3,getaddrinfo_handles + data._4_4_,getaddrinfo_cuncurrent_cb,name,
                           (char *)0x0,(addrinfo *)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
              ,0xb4,"r == 0");
      abort();
    }
    data._4_4_ = data._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,0xaa,"data != NULL");
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_concurrent) {
  int i, r;
  int* data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    callback_counts[i] = 0;

    data = (int*)malloc(sizeof(int));
    ASSERT(data != NULL);
    *data = i;
    getaddrinfo_handles[i].data = data;

    r = uv_getaddrinfo(uv_default_loop(),
                       &getaddrinfo_handles[i],
                       &getaddrinfo_cuncurrent_cb,
                       name,
                       NULL,
                       NULL);
    ASSERT(r == 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    ASSERT(callback_counts[i] == 1);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}